

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<bool>::Add(RepeatedField<bool> *this,bool *value)

{
  bool bVar1;
  uint uVar2;
  bool *pbVar3;
  bool tmp;
  
  uVar2 = this->current_size_;
  bVar1 = *value;
  if (uVar2 == this->total_size_) {
    Reserve(this,uVar2 + 1);
    pbVar3 = elements(this);
    pbVar3[uVar2] = bVar1;
  }
  else {
    pbVar3 = elements(this);
    pbVar3[uVar2] = bVar1;
  }
  this->current_size_ = uVar2 + 1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(const Element& value) {
  uint32 size = current_size_;
  if (static_cast<int>(size) == total_size_) {
    // value could reference an element of the array. Reserving new space will
    // invalidate the reference. So we must make a copy first.
    auto tmp = value;
    Reserve(total_size_ + 1);
    elements()[size] = std::move(tmp);
  } else {
    elements()[size] = value;
  }
  current_size_ = size + 1;
}